

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
* __thiscall
testing::internal::UnorderedElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
           *__return_storage_ptr__,UnorderedElementsAreMatcher *this)

{
  UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>
  *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  vector<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Matcher<const_phmap::priv::hash_internal::Enum_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (Matcher<const_phmap::priv::hash_internal::Enum_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
  ::reserve(&local_28,0);
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>
             *)operator_new(0x40);
  UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>
  ::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<phmap::priv::hash_internal::Enum_const&>*,std::vector<testing::Matcher<phmap::priv::hash_internal::Enum_const&>,std::allocator<testing::Matcher<phmap::priv::hash_internal::Enum_const&>>>>>
            (this_00,ExactMatch,
             (__normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_*,_std::vector<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002727f0;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
  ).buffer_.ptr = (void *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
  ).vtable_ = (VTable *)
              MatcherBase<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>
              ::
              GetVTable<testing::internal::MatcherBase<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>const*,true>>()
              ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(UnorderedElementsAreMatcherImpl<std::vector<phmap::priv::hash_internal::Enum,std::allocator<phmap::priv::hash_internal::Enum>>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00272780;
  std::
  vector<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>,_std::allocator<testing::Matcher<const_phmap::priv::hash_internal::Enum_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            UnorderedMatcherRequire::ExactMatch, matchers.begin(),
            matchers.end()));
  }